

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_xfer_write_resp_hd(Curl_easy *data,char *hd0,size_t hdlen,_Bool is_eos)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  _func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *UNRECOVERED_JUMPTABLE;
  CURLcode CVar3;
  
  UNRECOVERED_JUMPTABLE = data->conn->handler->write_resp_hd;
  if (UNRECOVERED_JUMPTABLE == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
    UNRECOVERED_JUMPTABLE = data->conn->handler->write_resp;
    if (UNRECOVERED_JUMPTABLE == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
      CVar3 = CURLE_OK;
      if (hdlen != 0 || is_eos) {
        CVar3 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,hd0,hdlen);
      }
    }
    else {
      CVar3 = (*UNRECOVERED_JUMPTABLE)(data,hd0,hdlen,is_eos);
    }
    if (is_eos && CVar3 == CURLE_OK) {
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 | 0x18;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"xfer_write_resp(len=%zu, eos=%d) -> %d",hdlen,(ulong)(uint)is_eos,
                     (ulong)CVar3);
    }
    return CVar3;
  }
  CVar3 = (*UNRECOVERED_JUMPTABLE)(data,hd0,hdlen,is_eos);
  return CVar3;
}

Assistant:

CURLcode Curl_xfer_write_resp_hd(struct Curl_easy *data,
                                 const char *hd0, size_t hdlen, bool is_eos)
{
  if(data->conn->handler->write_resp_hd) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    return data->conn->handler->write_resp_hd(data, hd0, hdlen, is_eos);
  }
  /* No special handling by protocol handler, write as response bytes */
  return Curl_xfer_write_resp(data, hd0, hdlen, is_eos);
}